

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.h
# Opt level: O0

void __thiscall
capnp::compiler::BrandScope::
compile<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__2>
          (BrandScope *this,Type *initBrand)

{
  ErrorReporter *errorReporter;
  Builder target;
  bool bVar1;
  size_t sVar2;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *this_00;
  unsigned_long *puVar3;
  BrandScope **ppBVar4;
  BrandedDecl *this_01;
  Range<unsigned_long> RVar5;
  Builder local_1b8;
  Builder local_190;
  uint local_164;
  Iterator IStack_160;
  uint j;
  Iterator __end0;
  Iterator __begin0;
  Range<unsigned_long> *__range5;
  Builder bindings;
  undefined1 local_108 [8];
  Builder scope;
  Iterator IStack_d8;
  uint i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_long> *__range3;
  undefined1 local_88 [8];
  Builder scopes;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *p;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *_p291;
  BrandScope *local_40;
  BrandScope *ptr;
  Vector<capnp::compiler::BrandScope_*> levels;
  Type *initBrand_local;
  BrandScope *this_local;
  
  levels.builder.disposer = (ArrayDisposer *)initBrand;
  kj::Vector<capnp::compiler::BrandScope_*>::Vector((Vector<capnp::compiler::BrandScope_*> *)&ptr);
  local_40 = this;
  while( true ) {
    sVar2 = kj::Array<capnp::compiler::BrandedDecl>::size(&local_40->params);
    if ((sVar2 != 0) || (((local_40->inherited & 1U) != 0 && (local_40->leafParamCount != 0)))) {
      kj::Vector<capnp::compiler::BrandScope*>::add<capnp::compiler::BrandScope*&>
                ((Vector<capnp::compiler::BrandScope*> *)&ptr,&local_40);
    }
    this_00 = kj::_::readMaybe<capnp::compiler::BrandScope,decltype(nullptr)>(&local_40->parent);
    if (this_00 == (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)0x0) break;
    scopes.builder._32_8_ = this_00;
    local_40 = kj::Own::operator_cast_to_BrandScope_((Own *)this_00);
  }
  sVar2 = kj::Vector<capnp::compiler::BrandScope_*>::size
                    ((Vector<capnp::compiler::BrandScope_*> *)&ptr);
  if (sVar2 != 0) {
    kj::
    NoInfer_<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++:1636:9)>
    ::Type::operator()((Builder *)&__range3,levels.builder.disposer);
    sVar2 = kj::Vector<capnp::compiler::BrandScope_*>::size
                      ((Vector<capnp::compiler::BrandScope_*> *)&ptr);
    capnp::schema::Brand::Builder::initScopes((Builder *)local_88,(Builder *)&__range3,(uint)sVar2);
    RVar5 = kj::indices<kj::Vector<capnp::compiler::BrandScope*>&>
                      ((Vector<capnp::compiler::BrandScope_*> *)&ptr);
    __begin3.value = RVar5.begin_;
    __end3 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3);
    IStack_d8 = kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3);
    while (bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end3,&stack0xffffffffffffff28),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end3);
      scope._builder._36_4_ = SUB84(*puVar3,0);
      List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Builder::operator[]
                ((Builder *)local_108,(Builder *)local_88,scope._builder._36_4_);
      ppBVar4 = kj::Vector<capnp::compiler::BrandScope_*>::operator[]
                          ((Vector<capnp::compiler::BrandScope_*> *)&ptr,
                           (ulong)(uint)scope._builder._36_4_);
      capnp::schema::Brand::Scope::Builder::setScopeId((Builder *)local_108,(*ppBVar4)->leafId);
      ppBVar4 = kj::Vector<capnp::compiler::BrandScope_*>::operator[]
                          ((Vector<capnp::compiler::BrandScope_*> *)&ptr,
                           (ulong)(uint)scope._builder._36_4_);
      if (((*ppBVar4)->inherited & 1U) == 0) {
        ppBVar4 = kj::Vector<capnp::compiler::BrandScope_*>::operator[]
                            ((Vector<capnp::compiler::BrandScope_*> *)&ptr,
                             (ulong)(uint)scope._builder._36_4_);
        sVar2 = kj::Array<capnp::compiler::BrandedDecl>::size(&(*ppBVar4)->params);
        capnp::schema::Brand::Scope::Builder::initBind
                  ((Builder *)&__range5,(Builder *)local_108,(uint)sVar2);
        RVar5 = kj::indices<capnp::List<capnp::schema::Brand::Binding,(capnp::Kind)3>::Builder&>
                          ((Builder *)&__range5);
        __begin0.value = RVar5.begin_;
        __end0 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin0);
        IStack_160 = kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin0);
        while (bVar1 = kj::Range<unsigned_long>::Iterator::operator==
                                 (&__end0,&stack0xfffffffffffffea0), ((bVar1 ^ 0xffU) & 1) != 0) {
          puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end0);
          local_164 = (uint)*puVar3;
          ppBVar4 = kj::Vector<capnp::compiler::BrandScope_*>::operator[]
                              ((Vector<capnp::compiler::BrandScope_*> *)&ptr,
                               (ulong)(uint)scope._builder._36_4_);
          this_01 = kj::Array<capnp::compiler::BrandedDecl>::operator[]
                              (&(*ppBVar4)->params,(ulong)local_164);
          errorReporter = this->errorReporter;
          List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Builder::operator[]
                    (&local_1b8,(Builder *)&__range5,local_164);
          capnp::schema::Brand::Binding::Builder::initType(&local_190,&local_1b8);
          target._builder.capTable = local_190._builder.capTable;
          target._builder.segment = local_190._builder.segment;
          target._builder.data = local_190._builder.data;
          target._builder.pointers = local_190._builder.pointers;
          target._builder.dataSize = local_190._builder.dataSize;
          target._builder.pointerCount = local_190._builder.pointerCount;
          target._builder._38_2_ = local_190._builder._38_2_;
          BrandedDecl::compileAsType(this_01,errorReporter,target);
          kj::Range<unsigned_long>::Iterator::operator++(&__end0);
        }
      }
      else {
        capnp::schema::Brand::Scope::Builder::setInherit((Builder *)local_108);
      }
      kj::Range<unsigned_long>::Iterator::operator++(&__end3);
    }
  }
  kj::Vector<capnp::compiler::BrandScope_*>::~Vector((Vector<capnp::compiler::BrandScope_*> *)&ptr);
  return;
}

Assistant:

void BrandScope::compile(InitBrandFunc&& initBrand) {
  kj::Vector<BrandScope*> levels;
  BrandScope* ptr = this;
  for (;;) {
    if (ptr->params.size() > 0 || (ptr->inherited && ptr->leafParamCount > 0)) {
      levels.add(ptr);
    }
    KJ_IF_SOME(p, ptr->parent) {
      ptr = p;
    } else {
      break;
    }
  }